

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddBuildTargetRule(cmLocalGenerator *this,string *llang,cmGeneratorTarget *target)

{
  Snapshot *this_00;
  cmMakefile *pcVar1;
  cmSourceFile *this_01;
  cmTarget *pcVar2;
  bool bVar3;
  char *pcVar4;
  cmCustomCommand *pcVar5;
  char *command;
  pointer s;
  pointer ppcVar6;
  allocator local_369;
  string targetFullPath;
  string comment;
  string linkLibs;
  string local_2e8;
  string langFlags;
  string createRule;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rules;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objVector;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> classes;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string config;
  string objs;
  RuleVariables vars;
  
  objs._M_dataplus._M_p = (pointer)&objs.field_2;
  objs._M_string_length = 0;
  objs.field_2._M_local_buf[0] = '\0';
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&vars,"CMAKE_BUILD_TYPE",(allocator *)&createRule);
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&vars);
  std::__cxx11::string::string((string *)&config,pcVar4,(allocator *)&targetName);
  std::__cxx11::string::~string((string *)&vars);
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetSourceFiles(target,&classes,&config);
  this_00 = &this->StateSnapshot;
  ppcVar6 = classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppcVar6 ==
        classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmGeneratorTarget::GetCreateRuleVariable(&createRule,target,llang,&config);
      pcVar1 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                     &createRule,"_USE_WATCOM_QUOTE");
      bVar3 = cmMakefile::IsOn(pcVar1,(string *)&vars);
      std::__cxx11::string::~string((string *)&vars);
      pcVar2 = target->Target;
      std::__cxx11::string::string((string *)&vars,"",(allocator *)&linkLibs);
      cmTarget::GetFullName(&targetName,pcVar2,(string *)&vars,false);
      std::__cxx11::string::~string((string *)&vars);
      linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
      linkLibs._M_string_length = 0;
      frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
      frameworkPath._M_string_length = 0;
      linkLibs.field_2._M_local_buf[0] = '\0';
      frameworkPath.field_2._M_local_buf[0] = '\0';
      linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
      linkPath._M_string_length = 0;
      flags._M_dataplus._M_p = (pointer)&flags.field_2;
      flags._M_string_length = 0;
      linkPath.field_2._M_local_buf[0] = '\0';
      flags.field_2._M_local_buf[0] = '\0';
      linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
      linkFlags._M_string_length = 0;
      linkFlags.field_2._M_local_buf[0] = '\0';
      GetTargetFlags(this,&linkLibs,&frameworkPath,&linkPath,&flags,&linkFlags,target,bVar3);
      std::operator+(&langFlags,&frameworkPath,&linkPath);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                     &langFlags,&linkLibs);
      std::__cxx11::string::operator=((string *)&linkLibs,(string *)&vars);
      std::__cxx11::string::~string((string *)&vars);
      std::__cxx11::string::~string((string *)&langFlags);
      memset(&vars,0,0xd8);
      vars.Language = (llang->_M_dataplus)._M_p;
      vars.Objects = objs._M_dataplus._M_p;
      vars.ObjectDir = ".";
      vars.Target = targetName._M_dataplus._M_p;
      vars.LinkLibraries = linkLibs._M_dataplus._M_p;
      vars.Flags = flags._M_dataplus._M_p;
      vars.LinkFlags = linkFlags._M_dataplus._M_p;
      langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
      langFlags._M_string_length = 0;
      langFlags.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&targetFullPath,"",(allocator *)&comment);
      AddLanguageFlags(this,&langFlags,llang,&targetFullPath);
      std::__cxx11::string::~string((string *)&targetFullPath);
      std::__cxx11::string::string((string *)&targetFullPath,"",(allocator *)&comment);
      AddArchitectureFlags(this,&langFlags,target,llang,&targetFullPath);
      std::__cxx11::string::~string((string *)&targetFullPath);
      vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar4 = cmMakefile::GetRequiredDefinition(this->Makefile,&createRule);
      std::__cxx11::string::string((string *)&targetFullPath,pcVar4,(allocator *)&comment);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rules,
                 &targetFullPath);
      std::__cxx11::string::~string((string *)&targetFullPath);
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandList(&rules,&commands);
      for (s = commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          s != commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
        ExpandRuleVariables(this,s,&vars);
        targetFullPath._M_dataplus._M_p = (pointer)0x0;
        targetFullPath._M_string_length = 0;
        targetFullPath.field_2._M_allocated_capacity = 0;
        cmSystemTools::ParseArguments_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&comment,(cmSystemTools *)(s->_M_dataplus)._M_p,command);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &targetFullPath,(const_iterator)targetFullPath._M_string_length,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )comment._M_dataplus._M_p,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )comment._M_string_length);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (value_type *)&targetFullPath);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&comment);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&targetFullPath);
      }
      pcVar2 = target->Target;
      std::__cxx11::string::string((string *)&comment,"",(allocator *)&local_2e8);
      cmTarget::GetFullPath(&targetFullPath,pcVar2,&comment,false,false);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::string((string *)&comment,"Linking ",(allocator *)&local_2e8);
      std::__cxx11::string::append((string *)&comment);
      std::__cxx11::string::append((char *)&comment);
      cmOutputConverter::Convert
                (&local_2e8,&this->super_cmOutputConverter,&targetFullPath,START_OUTPUT,UNCHANGED);
      std::__cxx11::string::append((string *)&comment);
      std::__cxx11::string::~string((string *)&local_2e8);
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&local_2e8,"",&local_369);
      pcVar4 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
      cmMakefile::AddCustomCommandToOutput
                (pcVar1,&targetFullPath,&objVector,&local_2e8,&commandLines,comment._M_dataplus._M_p
                 ,pcVar4,false,true,false);
      std::__cxx11::string::~string((string *)&local_2e8);
      cmMakefile::GetSource(this->Makefile,&targetFullPath);
      cmTarget::AddSource(target->Target,&targetFullPath);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&targetFullPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&rules);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      std::__cxx11::string::~string((string *)&langFlags);
      std::__cxx11::string::~string((string *)&linkFlags);
      std::__cxx11::string::~string((string *)&flags);
      std::__cxx11::string::~string((string *)&linkPath);
      std::__cxx11::string::~string((string *)&frameworkPath);
      std::__cxx11::string::~string((string *)&linkLibs);
      std::__cxx11::string::~string((string *)&targetName);
      std::__cxx11::string::~string((string *)&createRule);
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
      std::__cxx11::string::~string((string *)&config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objVector);
      std::__cxx11::string::~string((string *)&objs);
      return;
    }
    this_01 = *ppcVar6;
    pcVar5 = cmSourceFile::GetCustomCommand(this_01);
    if (pcVar5 == (cmCustomCommand *)0x0) {
      std::__cxx11::string::string((string *)&vars,"HEADER_FILE_ONLY",(allocator *)&targetName);
      bVar3 = cmSourceFile::GetPropertyAsBool(this_01,(string *)&vars);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&createRule,"EXTERNAL_OBJECT",(allocator *)&linkLibs)
        ;
        bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&createRule);
        std::__cxx11::string::~string((string *)&createRule);
        std::__cxx11::string::~string((string *)&vars);
        if (bVar3) goto LAB_002dc24d;
        vars.CMTarget = (cmTarget *)&vars.TargetCompilePDB;
        vars.TargetPDB = (char *)0x0;
        vars.TargetCompilePDB._0_1_ = 0;
        cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
        std::__cxx11::string::append((char *)&vars);
        std::__cxx11::string::append((char *)&vars);
        GetObjectFileNameWithoutTarget(&createRule,this,this_01,(string *)&vars,(bool *)0x0);
        if (createRule._M_string_length != 0) {
          pcVar4 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
          std::__cxx11::string::string((string *)&targetName,pcVar4,(allocator *)&linkLibs);
          std::__cxx11::string::append((char *)&targetName);
          std::__cxx11::string::append((string *)&targetName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&objVector,&targetName);
          AddCustomCommandToCreateObject(this,targetName._M_dataplus._M_p,llang,*ppcVar6,target);
          cmOutputConverter::Convert
                    (&linkLibs,&this->super_cmOutputConverter,&targetName,START_OUTPUT,SHELL);
          std::__cxx11::string::append((string *)&objs);
          std::__cxx11::string::~string((string *)&linkLibs);
          std::__cxx11::string::append((char *)&objs);
          std::__cxx11::string::~string((string *)&targetName);
        }
        std::__cxx11::string::~string((string *)&createRule);
      }
      std::__cxx11::string::~string((string *)&vars);
    }
LAB_002dc24d:
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::AddBuildTargetRule(const std::string& llang,
                                          cmGeneratorTarget& target)
{
  std::string objs;
  std::vector<std::string> objVector;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Add all the sources outputs to the depends of the target
  std::vector<cmSourceFile*> classes;
  target.GetSourceFiles(classes, config);
  for(std::vector<cmSourceFile*>::const_iterator i = classes.begin();
      i != classes.end(); ++i)
    {
    cmSourceFile* sf = *i;
    if(!sf->GetCustomCommand() &&
       !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
       !sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      std::string dir_max;
      dir_max += this->StateSnapshot.GetCurrentBinaryDirectory();
      dir_max += "/";
      std::string obj = this->GetObjectFileNameWithoutTarget(*sf, dir_max);
      if(!obj.empty())
        {
        std::string ofname = this->StateSnapshot.GetCurrentBinaryDirectory();
        ofname += "/";
        ofname += obj;
        objVector.push_back(ofname);
        this->AddCustomCommandToCreateObject(ofname.c_str(),
                                             llang, *(*i), target);
        objs += this->Convert(ofname,START_OUTPUT,SHELL);
        objs += " ";
        }
      }
    }
  std::string createRule = target.GetCreateRuleVariable(llang, config);
  bool useWatcomQuote = this->Makefile->IsOn(createRule+"_USE_WATCOM_QUOTE");
  std::string targetName = target.Target->GetFullName();
  // Executable :
  // Shared Library:
  // Static Library:
  // Shared Module:
  std::string linkLibs; // should be set
  std::string frameworkPath;
  std::string linkPath;
  std::string flags; // should be set
  std::string linkFlags; // should be set
  this->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       &target, useWatcomQuote);
  linkLibs = frameworkPath + linkPath + linkLibs;
  cmLocalGenerator::RuleVariables vars;
  vars.Language = llang.c_str();
  vars.Objects = objs.c_str();
  vars.ObjectDir = ".";
  vars.Target = targetName.c_str();
  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();

  std::string langFlags;
  this->AddLanguageFlags(langFlags, llang, "");
  this->AddArchitectureFlags(langFlags, &target, llang, "");
  vars.LanguageCompileFlags = langFlags.c_str();

  cmCustomCommandLines commandLines;
  std::vector<std::string> rules;
  rules.push_back(this->Makefile->GetRequiredDefinition(createRule));
  std::vector<std::string> commands;
  cmSystemTools::ExpandList(rules, commands);
  for(std::vector<std::string>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    // Expand the full command line string.
    this->ExpandRuleVariables(*i, vars);
    // Parse the string to get the custom command line.
    cmCustomCommandLine commandLine;
    std::vector<std::string> cmd = cmSystemTools::ParseArguments(i->c_str());
    commandLine.insert(commandLine.end(), cmd.begin(), cmd.end());

    // Store this command line.
    commandLines.push_back(commandLine);
    }
  std::string targetFullPath = target.Target->GetFullPath();
  // Generate a meaningful comment for the command.
  std::string comment = "Linking ";
  comment += llang;
  comment += " target ";
  comment += this->Convert(targetFullPath, START_OUTPUT);
  this->Makefile->AddCustomCommandToOutput(
    targetFullPath,
    objVector,
    "",
    commandLines,
    comment.c_str(),
    this->StateSnapshot.GetCurrentBinaryDirectory()
    );
  this->Makefile->GetSource(targetFullPath);
  target.Target->AddSource(targetFullPath);
}